

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatusBar.cpp
# Opt level: O1

void __thiscall StatusBar::drawSelf(StatusBar *this,PixelGameEngine *pge)

{
  bool bVar1;
  char cVar2;
  int32_t iVar3;
  Pixel col;
  vf2d *pvVar4;
  ulong uVar5;
  vf2d vVar6;
  char cVar7;
  ulong __val;
  float alpha;
  string __str;
  vf2d local_80;
  undefined1 local_78 [8];
  vf2d local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [40];
  
  iVar3 = olc::PixelGameEngine::ScreenWidth(pge);
  local_78._4_4_ = 4.0;
  local_78._0_4_ = (float)(iVar3 / 2) + -18.0;
  local_58._0_4_ = 36.0;
  local_58._4_4_ = 12.0;
  olc::PixelGameEngine::FillRectDecal
            (pge,(vf2d *)local_78,(vf2d *)local_58,(Pixel)olc::BLUE.field_1);
  iVar3 = olc::PixelGameEngine::ScreenWidth(pge);
  local_80.y = 6.0;
  local_80.x = (float)(iVar3 / 2) + -16.0;
  __val = this->progress / 1000;
  cVar7 = '\x01';
  if (9999 < this->progress) {
    uVar5 = __val;
    cVar2 = '\x04';
    do {
      cVar7 = cVar2;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_0011a5a8;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_0011a5a8;
      }
      if (uVar5 < 10000) goto LAB_0011a5a8;
      bVar1 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar2 = cVar7 + '\x04';
    } while (bVar1);
    cVar7 = cVar7 + '\x01';
  }
LAB_0011a5a8:
  local_58._0_8_ = (long)local_58 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_58,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_58._0_8_,local_58._8_4_,__val);
  pvVar4 = (vf2d *)std::__cxx11::string::append(local_58);
  vVar6 = (vf2d)(pvVar4 + 2);
  if (*pvVar4 == vVar6) {
    local_68._M_allocated_capacity = *(undefined8 *)vVar6;
    local_68._8_8_ = pvVar4[3];
    local_78 = (undefined1  [8])&local_68;
  }
  else {
    local_68._M_allocated_capacity = *(undefined8 *)vVar6;
    local_78 = (undefined1  [8])*pvVar4;
  }
  local_70 = pvVar4[1];
  *pvVar4 = vVar6;
  pvVar4[1].x = 0.0;
  pvVar4[1].y = 0.0;
  *(undefined1 *)&pvVar4[2].x = 0;
  local_58._32_8_ = 0x3f8000003f800000;
  olc::PixelGameEngine::DrawStringDecal
            (pge,&local_80,(string *)local_78,(Pixel)olc::WHITE.field_1,(vf2d *)(local_58 + 0x20));
  if (local_78 != (undefined1  [8])&local_68) {
    operator_delete((void *)local_78,local_68._M_allocated_capacity + 1);
  }
  if (local_58._0_8_ != (long)local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
  }
  iVar3 = olc::PixelGameEngine::ScreenWidth(pge);
  olc::PixelGameEngine::GetTextSize((PixelGameEngine *)local_58,(string *)pge);
  local_78._4_4_ = 30.0;
  local_78._0_4_ = (float)iVar3 * 0.5 - (float)((int)local_58._0_4_ / 2);
  alpha = this->visibilityAmount;
  if (alpha <= 0.0) {
    alpha = 0.0;
  }
  if (1.0 <= alpha) {
    alpha = 1.0;
  }
  col = olc::PixelF(1.0,0.0,0.0,alpha);
  local_80.x = 1.0;
  local_80.y = 1.0;
  olc::PixelGameEngine::DrawStringDecal(pge,(vf2d *)local_78,&this->currentJoke,col,&local_80);
  return;
}

Assistant:

void StatusBar::drawSelf(olc::PixelGameEngine *pge) const {
    pge->FillRectDecal({pge->ScreenWidth() / 2 - 18.0f, 4}, {36, 12}, olc::BLUE);
    pge->DrawStringDecal({pge->ScreenWidth() / 2 - 16.0f, 6}, std::to_string(progress / 1000) + "%");
    pge->DrawStringDecal(
	    {pge->ScreenWidth() / 2.0f - pge->GetTextSize(currentJoke).x / 2, 30},
	    currentJoke,
	    olc::PixelF(1.0f, 0.0f, 0.0f, std::min(1.0f, std::max(0.0f, visibilityAmount)))
	    );
}